

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

TopLevelScriptLoadFunctionBodyResolveInfo * __thiscall
TTD::EventLog::AddScriptLoad
          (EventLog *this,FunctionBody *fb,ModuleID moduleId,uint64 sourceContextId,byte *source,
          uint32 sourceLen,LoadScriptFlag loadFlag)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  Utf8SourceInfo *this_00;
  uint *puVar4;
  uint local_54;
  undefined1 local_4d;
  uint32 local_4c;
  bool isUtf8;
  TopLevelScriptLoadFunctionBodyResolveInfo *pTStack_48;
  uint32 fCount;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo;
  byte *pbStack_38;
  uint32 sourceLen_local;
  byte *source_local;
  uint64 sourceContextId_local;
  FunctionBody *pFStack_20;
  ModuleID moduleId_local;
  FunctionBody *fb_local;
  EventLog *this_local;
  
  fbInfo._4_4_ = sourceLen;
  pbStack_38 = source;
  source_local = (byte *)sourceContextId;
  sourceContextId_local._4_4_ = moduleId;
  pFStack_20 = fb;
  fb_local = (FunctionBody *)this;
  pTStack_48 = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>
               ::NextOpenEntry(&this->m_loadedTopLevelScripts);
  uVar1 = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
          Count(&this->m_loadedTopLevelScripts);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_newFunctionTopLevelScripts);
  local_4c = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
             Count(&this->m_evalTopLevelScripts);
  local_4c = uVar1 + uVar2 + local_4c;
  local_4d = (loadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source;
  NSSnapValues::ExtractTopLevelLoadedFunctionBodyInfo
            (pTStack_48,pFStack_20,local_4c,sourceContextId_local._4_4_,(uint64)source_local,
             (bool)local_4d,pbStack_38,fbInfo._4_4_,loadFlag,&this->m_miscSlabAllocator);
  this_00 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFStack_20);
  uVar3 = Js::Utf8SourceInfo::GetSourceInfoId(this_00);
  local_54 = uVar3 + 1;
  puVar4 = max<unsigned_int>(&this->m_sourceInfoCount,&local_54);
  this->m_sourceInfoCount = *puVar4;
  return pTStack_48;
}

Assistant:

const NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo* EventLog::AddScriptLoad(Js::FunctionBody* fb, Js::ModuleID moduleId, uint64 sourceContextId, const byte* source, uint32 sourceLen, LoadScriptFlag loadFlag)
    {
        NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo = this->m_loadedTopLevelScripts.NextOpenEntry();
        uint32 fCount = (this->m_loadedTopLevelScripts.Count() + this->m_newFunctionTopLevelScripts.Count() + this->m_evalTopLevelScripts.Count());
        bool isUtf8 = ((loadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source);

        NSSnapValues::ExtractTopLevelLoadedFunctionBodyInfo(fbInfo, fb, fCount, moduleId, sourceContextId, isUtf8, source, sourceLen, loadFlag, this->m_miscSlabAllocator);
        this->m_sourceInfoCount = max(this->m_sourceInfoCount, fb->GetUtf8SourceInfo()->GetSourceInfoId() + 1);

        return fbInfo;
    }